

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::sampleMaskToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *bitfield,int numBits)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)bitfield);
  if (0 < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 2)) {
    uVar6 = (int)bitfield - 1;
    lVar3 = 0;
    bVar4 = false;
    do {
      uVar7 = 0;
      bVar8 = false;
      uVar5 = uVar6;
      do {
        if ((int)uVar5 < 0) {
          bVar4 = true;
        }
        else if ((*(uint *)(*(long *)this + lVar3 * 4) >> ((uint)uVar7 & 0x1f) & 1) != 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p[uVar5] = '1';
        }
        if ((int)uVar5 < 0) break;
        bVar8 = 0x1e < uVar7;
        uVar7 = uVar7 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar7 != 0x20);
      if (!bVar8) {
        if (bVar4) {
          return __return_storage_ptr__;
        }
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar1) {
          return __return_storage_ptr__;
        }
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      lVar3 = lVar3 + 1;
      uVar6 = uVar6 - 0x20;
    } while (lVar3 < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string sampleMaskToString (const std::vector<deUint32>& bitfield, int numBits)
{
	std::string result(numBits, '0');

	// move from back to front and set chars to 1
	for (int wordNdx = 0; wordNdx < (int)bitfield.size(); ++wordNdx)
	{
		for (int bit = 0; bit < 32; ++bit)
		{
			const int targetCharNdx = numBits - (wordNdx*32+bit) - 1;

			// beginning of the string reached
			if (targetCharNdx < 0)
				return result;

			if ((bitfield[wordNdx] >> bit) & 0x01)
				result[targetCharNdx] = '1';
		}
	}

	return result;
}